

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_tpdf * lysp_typedef_match(char *name,lysp_tpdf *typedefs)

{
  int iVar1;
  ulong local_38;
  ulong local_28;
  uint64_t u;
  lysp_tpdf *typedefs_local;
  char *name_local;
  
  local_28 = 0;
  while( true ) {
    if (typedefs == (lysp_tpdf *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = *(ulong *)&typedefs[-1].flags;
    }
    if (local_38 <= local_28) break;
    iVar1 = strcmp(name,typedefs[local_28].name);
    if (iVar1 == 0) {
      return typedefs + local_28;
    }
    local_28 = local_28 + 1;
  }
  return (lysp_tpdf *)0x0;
}

Assistant:

static const struct lysp_tpdf *
lysp_typedef_match(const char *name, const struct lysp_tpdf *typedefs)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(typedefs, u) {
        if (!strcmp(name, typedefs[u].name)) {
            /* match */
            return &typedefs[u];
        }
    }
    return NULL;
}